

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_int(void)

{
  char cVar1;
  bool bVar2;
  XSValue *pXVar3;
  char *pcVar4;
  wchar16 *pwVar5;
  long lVar6;
  char *pcVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  Status myStatus;
  StrX local_120;
  Status myStatus_14;
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2 [12];
  char lex_v_ran_iv_1 [12];
  char lex_v_ran_v_2 [12];
  char lex_v_ran_v_1 [12];
  char data_canrep_2 [6];
  char data_canrep_1 [6];
  char data_rawstr_2 [9];
  char lex_v_ran_iv_1_canrep [11];
  char lex_v_ran_v_1_canrep [11];
  char data_rawstr_1 [14];
  char lex_v_ran_iv_2_canrep [12];
  char lex_v_ran_v_2_canrep [12];
  char lex_v_ran_v_0 [15];
  
  builtin_strncpy(lex_v_ran_v_0,"    1234     \n",0xf);
  builtin_strncpy(lex_v_ran_v_1 + 8,"647",4);
  builtin_strncpy(lex_v_ran_v_1,"+2147483",8);
  builtin_strncpy(lex_v_ran_v_2 + 8,"648",4);
  builtin_strncpy(lex_v_ran_v_2,"-2147483",8);
  builtin_strncpy(lex_v_ran_iv_1 + 8,"648",4);
  builtin_strncpy(lex_v_ran_iv_1,"+2147483",8);
  builtin_strncpy(lex_v_ran_iv_2 + 8,"649",4);
  builtin_strncpy(lex_v_ran_iv_2,"-2147483",8);
  builtin_strncpy(lex_v_ran_v_1_canrep,"2147483647",0xb);
  builtin_strncpy(lex_v_ran_v_2_canrep + 8,"648",4);
  builtin_strncpy(lex_v_ran_v_2_canrep,"-2147483",8);
  builtin_strncpy(lex_v_ran_iv_1_canrep,"2147483648",0xb);
  builtin_strncpy(lex_v_ran_iv_2_canrep + 8,"649",4);
  builtin_strncpy(lex_v_ran_iv_2_canrep,"-2147483",8);
  builtin_strncpy(lex_iv_1,"1234.456",9);
  builtin_strncpy(lex_iv_2,"1234b56",8);
  builtin_strncpy(data_rawstr_1 + 8,"45  \n",6);
  builtin_strncpy(data_rawstr_1,"    +123",8);
  builtin_strncpy(data_canrep_1,"12345",6);
  builtin_strncpy(data_rawstr_2,"00012345",9);
  builtin_strncpy(data_canrep_2,"12345",6);
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_120,lex_v_ran_v_0);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (cVar1 == '\0') {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x788,lex_v_ran_v_0,local_120.fLocalForm,1);
    StrX::~StrX(&local_120);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_120,lex_v_ran_v_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (cVar1 == '\0') {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x789,lex_v_ran_v_1,local_120.fLocalForm,1);
    StrX::~StrX(&local_120);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_120,lex_v_ran_v_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (cVar1 == '\0') {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x78a,lex_v_ran_v_2,local_120.fLocalForm,1);
    StrX::~StrX(&local_120);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_120,lex_v_ran_iv_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pcVar7 = local_120.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x78d,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_0010ea0f;
    }
  }
  else {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x78d,lex_v_ran_iv_1,local_120.fLocalForm,0);
LAB_0010ea0f:
    StrX::~StrX(&local_120);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_120,lex_v_ran_iv_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pcVar7 = local_120.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x78e,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_0010ead9;
    }
  }
  else {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x78e,lex_v_ran_iv_2,local_120.fLocalForm,0);
LAB_0010ead9:
    StrX::~StrX(&local_120);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_120,lex_iv_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pcVar7 = local_120.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x791,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_0010eba3;
    }
  }
  else {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x791,lex_iv_1,local_120.fLocalForm,0);
LAB_0010eba3:
    StrX::~StrX(&local_120);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_120,lex_iv_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pcVar7 = local_120.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x792,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_0010ec6d;
    }
  }
  else {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x792,lex_iv_2,local_120.fLocalForm,0);
LAB_0010ec6d:
    StrX::~StrX(&local_120);
    errSeen = 1;
  }
  iVar10 = 2;
  while (iVar9 = iVar10 + -1, iVar10 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_120,lex_v_ran_v_0);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7af,lex_v_ran_v_0);
      StrX::~StrX(&local_120);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      if (*(uint *)(pXVar3 + 8) != 0x4d2) {
        printf("ACTVALUE_TEST Unexpected dt_int XSValue, got %d expected %d\n",pvVar8,0x4d2);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_120,lex_v_ran_v_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b1,lex_v_ran_v_1);
      StrX::~StrX(&local_120);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      if (*(uint *)(pXVar3 + 8) != 0x7fffffff) {
        printf("ACTVALUE_TEST Unexpected dt_int XSValue, got %d expected %d\n",pvVar8,0x7fffffff);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_120,lex_v_ran_v_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b2,lex_v_ran_v_2);
      StrX::~StrX(&local_120);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      printf("ACTVALUE_TEST Unexpected dt_int XSValue, got %d expected %d\n",pvVar8,0x80000000);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_120,lex_v_ran_iv_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar7 = local_120.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b3,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_120);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pvVar8 = (void *)0x7b3;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b3,lex_v_ran_iv_1);
      StrX::~StrX(&local_120);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_120,lex_v_ran_iv_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar7 = local_120.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b4,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_120);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pvVar8 = (void *)0x7b4;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b4,lex_v_ran_iv_2);
      StrX::~StrX(&local_120);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_120,lex_iv_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar7 = local_120.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b6,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_120);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pvVar8 = (void *)0x7b6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b6,lex_iv_1);
      StrX::~StrX(&local_120);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_120,lex_iv_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    iVar10 = iVar9;
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar7 = local_120.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b7,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_120);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pvVar8 = (void *)0x7b7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b7,lex_iv_2);
      StrX::~StrX(&local_120);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
  }
  iVar10 = 2;
LAB_0010f2a5:
  iVar9 = iVar10 + -1;
  if (iVar10 != 0) {
    myStatus_14 = st_Init;
    StrX::StrX(&local_120,data_rawstr_1);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_120.fUnicodeForm,dt_int,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d5,data_rawstr_1);
      StrX::~StrX(&local_120);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_1);
      if (!bVar2) {
        StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d5,data_rawstr_1,local_120.fLocalForm,_myStatus,data_canrep_1);
        StrX::~StrX(&local_120);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_120,data_rawstr_2);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_120.fUnicodeForm,dt_int,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d6,data_rawstr_2);
      StrX::~StrX(&local_120);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_2);
      if (!bVar2) {
        StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d6,data_rawstr_2,local_120.fLocalForm,_myStatus,data_canrep_2);
        StrX::~StrX(&local_120);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_120,lex_v_ran_v_1);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_120.fUnicodeForm,dt_int,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d8,lex_v_ran_v_1);
      StrX::~StrX(&local_120);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_v_1_canrep);
      if (!bVar2) {
        StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d8,lex_v_ran_v_1,local_120.fLocalForm,_myStatus,lex_v_ran_v_1_canrep);
        StrX::~StrX(&local_120);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_120,lex_v_ran_v_2);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_120.fUnicodeForm,dt_int,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d9,lex_v_ran_v_2);
      StrX::~StrX(&local_120);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_v_2_canrep);
      if (!bVar2) {
        StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d9,lex_v_ran_v_2,local_120.fLocalForm,_myStatus,lex_v_ran_v_2_canrep);
        StrX::~StrX(&local_120);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_120,lex_iv_1);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,iVar10 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    if (lVar6 == 0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar7 = local_120.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x7db,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_120);
        goto LAB_0010f7cb;
      }
    }
    else {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7db,lex_iv_1);
      StrX::~StrX(&local_120);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0010f7cb:
      errSeen = 1;
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_120,lex_iv_2);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,iVar10 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_120);
    iVar10 = iVar9;
    if (lVar6 == 0) goto LAB_0010f859;
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7dc,lex_iv_2);
    StrX::~StrX(&local_120);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
    goto LAB_0010f8a8;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_120,lex_v_ran_iv_1);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (lVar6 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pcVar7 = local_120.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x7e1,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      StrX::~StrX(&local_120);
      goto LAB_0010f993;
    }
  }
  else {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e1,lex_v_ran_iv_1);
    StrX::~StrX(&local_120);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0010f993:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_120,lex_v_ran_iv_2);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_120.fUnicodeForm,dt_int,&myStatus,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (lVar6 == 0) {
    if (myStatus == st_FOCA0002) goto LAB_0010fa7d;
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    pcVar7 = local_120.fLocalForm;
    pcVar4 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x7e2,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
    StrX::~StrX(&local_120);
  }
  else {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e2,lex_v_ran_iv_2);
    StrX::~StrX(&local_120);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
  }
  errSeen = 1;
LAB_0010fa7d:
  myStatus_14 = st_Init;
  StrX::StrX(&local_120,lex_v_ran_iv_1);
  pwVar5 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_120.fUnicodeForm,dt_int,&myStatus_14,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (pwVar5 == (wchar16 *)0x0) {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e5,lex_v_ran_iv_1);
    StrX::~StrX(&local_120);
    errSeen = 1;
  }
  else {
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    _myStatus = pcVar7;
    bVar2 = xercesc_4_0::XMLString::equals(pcVar7,lex_v_ran_iv_1_canrep);
    if (!bVar2) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x7e5,lex_v_ran_iv_1,local_120.fLocalForm,pcVar7,lex_v_ran_iv_1_canrep);
      StrX::~StrX(&local_120);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_14 = st_Init;
  StrX::StrX(&local_120,lex_v_ran_iv_2);
  pwVar5 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_120.fUnicodeForm,dt_int,&myStatus_14,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  if (pwVar5 == (wchar16 *)0x0) {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e6,lex_v_ran_iv_2,local_120.fLocalForm);
    StrX::~StrX(&local_120);
    errSeen = 1;
  }
  else {
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    _myStatus = pcVar7;
    bVar2 = xercesc_4_0::XMLString::equals(pcVar7,lex_v_ran_iv_2_canrep);
    if (!bVar2) {
      StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x7e6,lex_v_ran_iv_2,local_120.fLocalForm,pcVar7,lex_v_ran_iv_2_canrep);
      StrX::~StrX(&local_120);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  return;
LAB_0010f859:
  if (myStatus != st_FOCA0002) {
    StrX::StrX(&local_120,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    pcVar7 = local_120.fLocalForm;
    pcVar4 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x7dc,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
    StrX::~StrX(&local_120);
LAB_0010f8a8:
    errSeen = 1;
  }
  goto LAB_0010f2a5;
}

Assistant:

void test_dt_int()
{
    const XSValue::DataType dt = XSValue::dt_int;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="    1234     \n";

    const char lex_v_ran_v_1[]="+2147483647";
    const char lex_v_ran_v_2[]="-2147483648";
    const char lex_v_ran_iv_1[]="+2147483648";
    const char lex_v_ran_iv_2[]="-2147483649";

    XSValue::XSValue_Data act_v_ran_v_0;   act_v_ran_v_0.fValue.f_int = (int)1234;
    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_int = (int)+2147483647;
    XSValue::XSValue_Data act_v_ran_v_2;   act_v_ran_v_2.fValue.f_int = (int)-2147483648;

    const char lex_v_ran_v_1_canrep[]="2147483647";
    const char lex_v_ran_v_2_canrep[]="-2147483648";
    const char lex_v_ran_iv_1_canrep[]="2147483648";
    const char lex_v_ran_iv_2_canrep[]="-2147483649";

    const char lex_iv_1[]="1234.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.17.2 Canonical representation
 *
 * The canonical representation for int is defined by prohibiting certain options from the
 * Lexical representation (3.3.17.1). Specifically,
 * 1. the the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="    +12345  \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,        DONT_CARE);
        CANREP_TEST(data_rawstr_2, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,        XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep, DONT_CARE);

        CANREP_TEST(lex_iv_1,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}